

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O1

Edge * __thiscall S2Polygon::Shape::edge(Edge *__return_storage_ptr__,Shape *this,int e)

{
  S2Polygon *pSVar1;
  int *piVar2;
  pointer puVar3;
  VType VVar4;
  long lVar5;
  int *piVar6;
  S2Point *pSVar7;
  S2Point *pSVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  S2LogMessage SStack_38;
  
  if (e < *(int *)&(this->super_S2Shape).field_0xc) {
    pSVar1 = this->polygon_;
    piVar2 = this->cumulative_edges_;
    if (piVar2 == (int *)0x0) {
      puVar3 = (pSVar1->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar10 = *(int *)((long)(puVar3->_M_t).
                              super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t + 0xc
                       );
      uVar9 = 0;
      if (iVar10 <= e) {
        do {
          e = e - iVar10;
          lVar5 = uVar9 + 1;
          uVar9 = uVar9 + 1;
          iVar10 = *(int *)((long)puVar3[lVar5]._M_t.
                                  super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t +
                           0xc);
        } while (iVar10 <= e);
      }
    }
    else {
      piVar6 = piVar2;
      uVar9 = (long)(int)((ulong)((long)(pSVar1->loops_).
                                        super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pSVar1->loops_).
                                       super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
      while (0 < (long)uVar9) {
        uVar11 = uVar9 >> 1;
        uVar12 = ~uVar11 + uVar9;
        uVar9 = uVar11;
        if (piVar6[uVar11] <= e) {
          piVar6 = piVar6 + uVar11 + 1;
          uVar9 = uVar12;
        }
      }
      uVar9 = (ulong)((long)piVar6 + (-4 - (long)piVar2)) >> 2;
      e = e - piVar6[-1];
    }
    pSVar7 = S2Loop::oriented_vertex
                       ((S2Loop *)
                        (pSVar1->loops_).
                        super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(int)uVar9]._M_t.
                        super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t,e);
    pSVar8 = S2Loop::oriented_vertex
                       ((S2Loop *)
                        (pSVar1->loops_).
                        super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(int)uVar9]._M_t.
                        super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t,e + 1);
    VVar4 = pSVar7->c_[1];
    (__return_storage_ptr__->v0).c_[0] = pSVar7->c_[0];
    (__return_storage_ptr__->v0).c_[1] = VVar4;
    (__return_storage_ptr__->v0).c_[2] = pSVar7->c_[2];
    VVar4 = pSVar8->c_[1];
    (__return_storage_ptr__->v1).c_[0] = pSVar8->c_[0];
    (__return_storage_ptr__->v1).c_[1] = VVar4;
    (__return_storage_ptr__->v1).c_[2] = pSVar8->c_[2];
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            (&SStack_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
             ,0x5cf,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_38.stream_,"Check failed: (e) < (num_edges()) ",0x22);
  abort();
}

Assistant:

S2Shape::Edge S2Polygon::Shape::edge(int e) const {
  S2_DCHECK_LT(e, num_edges());
  const S2Polygon* p = polygon();
  int i;
  if (cumulative_edges_) {
    // "upper_bound" finds the loop just beyond the one we want.
    int* start = std::upper_bound(cumulative_edges_,
                                  cumulative_edges_ + p->num_loops(), e) - 1;
    i = start - cumulative_edges_;
    e -= *start;
  } else {
    // When the number of loops is small, linear search is faster.  Most often
    // there is exactly one loop and the code below executes zero times.
    for (i = 0; e >= p->loop(i)->num_vertices(); ++i) {
      e -= p->loop(i)->num_vertices();
    }
  }
  return Edge(p->loop(i)->oriented_vertex(e),
              p->loop(i)->oriented_vertex(e + 1));
}